

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_77::AsyncTee::~AsyncTee(AsyncTee *this)

{
  Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *local_68;
  bool local_59;
  Fault local_50;
  Fault f;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch> *branch;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch> *__end2;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch> *__begin2;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch> (*__range2) [2];
  bool hasBranches;
  AsyncTee *this_local;
  
  __range2._7_1_ = false;
  for (__end2 = this->branches;
      (Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *)__end2 !=
      &this->stoppage; __end2 = __end2 + 1) {
    local_59 = true;
    if (__range2._7_1_ == false) {
      local_59 = Maybe<kj::(anonymous_namespace)::AsyncTee::Branch>::operator!=(__end2,(void *)0x0);
    }
    __range2._7_1_ = local_59;
  }
  if (((__range2._7_1_ ^ 0xffU) & 1) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ba,FAILED,"!hasBranches","\"destroying AsyncTee with branch still alive\"",
               (char (*) [44])"destroying AsyncTee with branch still alive");
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  Promise<void>::~Promise(&this->pullPromise);
  Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_>::~Maybe
            (&this->stoppage);
  local_68 = &this->stoppage;
  do {
    local_68 = (Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *)
               ((long)(local_68 + -1) + 0x108);
    Maybe<kj::(anonymous_namespace)::AsyncTee::Branch>::~Maybe
              ((Maybe<kj::(anonymous_namespace)::AsyncTee::Branch> *)local_68);
  } while (local_68 !=
           (Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *)
           this->branches);
  Maybe<unsigned_long>::~Maybe(&this->length);
  Own<kj::AsyncInputStream>::~Own(&this->inner);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~AsyncTee() noexcept(false) {
    bool hasBranches = false;
    for (auto& branch: branches) {
      hasBranches = hasBranches || branch != nullptr;
    }
    KJ_ASSERT(!hasBranches, "destroying AsyncTee with branch still alive") {
      // Don't std::terminate().
      break;
    }
  }